

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

var __thiscall cs::runtime_type::parse_mul(runtime_type *this,var *a,var *b)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined *puVar3;
  numeric *this_00;
  numeric *rhs;
  runtime_error *this_01;
  any *in_RCX;
  anon_union_16_2_310e9938_for_data local_38;
  undefined1 local_28 [16];
  
  if (b->mDat == (proxy *)0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*b->mDat->data->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var,iVar2);
  }
  pcVar1 = *(char **)(puVar3 + 8);
  if (pcVar1 != "N2cs7numericE") {
    if (*pcVar1 == '*') goto LAB_00265058;
    iVar2 = strcmp(pcVar1,"N2cs7numericE");
    if (iVar2 != 0) goto LAB_00265058;
  }
  if (in_RCX->mDat == (proxy *)0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*in_RCX->mDat->data->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var_00,iVar2);
  }
  pcVar1 = *(char **)(puVar3 + 8);
  if (pcVar1 != "N2cs7numericE") {
    if (*pcVar1 != '*') {
      iVar2 = strcmp(pcVar1,"N2cs7numericE");
      if (iVar2 == 0) goto LAB_0026501c;
    }
LAB_00265058:
    this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_38._int = (numeric_integer)local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Unsupported operator operations(Mul).","");
    runtime_error::runtime_error(this_01,(string *)&local_38);
    __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
LAB_0026501c:
  this_00 = cs_impl::any::const_val<cs::numeric>(b);
  rhs = cs_impl::any::const_val<cs::numeric>(in_RCX);
  numeric::operator*(this_00,rhs);
  cs_impl::any::any<cs::numeric>((any *)this,(numeric *)&local_38);
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_mul(const var &a, const var &b)
	{
		if (a.type() == typeid(numeric) && b.type() == typeid(numeric))
			return a.const_val<numeric>() * b.const_val<numeric>();
		else
			throw runtime_error("Unsupported operator operations(Mul).");
	}